

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O3

int __thiscall
cmCPackExternalGenerator::cmCPackExternalVersionGenerator::WriteVersion
          (cmCPackExternalVersionGenerator *this,Value *root)

{
  int iVar1;
  Value *pVVar2;
  Value VStack_68;
  Value local_40;
  
  iVar1 = (*this->_vptr_cmCPackExternalVersionGenerator[3])();
  Json::Value::Value(&local_40,iVar1);
  pVVar2 = Json::Value::operator[](root,"formatVersionMajor");
  Json::Value::operator=(pVVar2,&local_40);
  Json::Value::~Value(&local_40);
  iVar1 = (*this->_vptr_cmCPackExternalVersionGenerator[4])(this);
  Json::Value::Value(&VStack_68,iVar1);
  pVVar2 = Json::Value::operator[](root,"formatVersionMinor");
  Json::Value::operator=(pVVar2,&VStack_68);
  Json::Value::~Value(&VStack_68);
  return 1;
}

Assistant:

int cmCPackExternalGenerator::cmCPackExternalVersionGenerator::WriteVersion(
  Json::Value& root)
{
  root["formatVersionMajor"] = this->GetVersionMajor();
  root["formatVersionMinor"] = this->GetVersionMinor();

  return 1;
}